

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::MultipleReporters::testRunEnded(MultipleReporters *this,TestRunStats *testRunStats)

{
  pointer pPVar1;
  pointer pPVar2;
  
  pPVar1 = (this->m_reporters).
           super__Vector_base<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar2 = (this->m_reporters).
                super__Vector_base<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    (*(pPVar2->m_p->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])
              (pPVar2->m_p,testRunStats);
  }
  return;
}

Assistant:

Generic::AllOf<ExpressionT> Matcher<ExpressionT>::operator && ( Matcher<ExpressionT> const& other ) const {
        Generic::AllOf<ExpressionT> allOfExpr;
        allOfExpr.add( *this );
        allOfExpr.add( other );
        return allOfExpr;
    }